

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PythonDataType.h
# Opt level: O2

Ref<anurbs::BrepFace> __thiscall
anurbs::PythonDataType<anurbs::Model,_anurbs::BrepFace>::add
          (PythonDataType<anurbs::Model,_anurbs::BrepFace> *this,Model *self,
          Pointer<anurbs::BrepFace> *data)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::BrepFace> RVar1;
  __shared_ptr<anurbs::BrepFace,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  std::__shared_ptr<anurbs::BrepFace,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,&data->super___shared_ptr<anurbs::BrepFace,_(__gnu_cxx::_Lock_policy)2>);
  Model::add<anurbs::BrepFace>((Model *)this,(Pointer<anurbs::BrepFace> *)self);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Ref<anurbs::BrepFace>)
         RVar1.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Ref<TData> add(TModel& self, Pointer<TData> data)
    {
        return self.template add<TData>(data);
    }